

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatred.cpp
# Opt level: O3

longdouble * __thiscall
TPZMatRed<long_double,_TPZFMatrix<long_double>_>::s
          (TPZMatRed<long_double,_TPZFMatrix<long_double>_> *this,int64_t r,int64_t c)

{
  TPZMatrix<long_double> *pTVar1;
  int iVar2;
  long lVar3;
  undefined4 extraout_var;
  longdouble *plVar4;
  long lVar5;
  long lVar6;
  int64_t iVar7;
  long lVar8;
  
  lVar3 = this->fDim0;
  iVar7 = c;
  if (r < lVar3) {
    iVar2 = (*(this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable.
              _vptr_TPZSavable[0x10])(this);
    if (c < r && iVar2 != 0) {
      iVar7 = r;
      r = c;
    }
    lVar3 = this->fDim0;
  }
  lVar6 = iVar7 - lVar3;
  if (iVar7 < lVar3 && r < lVar3) {
    pTVar1 = ((this->fK00).fRef)->fPointer;
    iVar2 = (*(pTVar1->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x22])(pTVar1,r,iVar7)
    ;
    return (longdouble *)CONCAT44(extraout_var,iVar2);
  }
  lVar5 = r - lVar3;
  if (r < lVar3) {
    lVar8 = iVar7 - lVar3;
    if (lVar3 <= iVar7) {
      lVar3 = (this->fK01).super_TPZMatrix<long_double>.super_TPZBaseMatrix.fRow;
      if (((-1 < r && r < lVar3) && (-1 < lVar8)) &&
         (lVar8 < (this->fK01).super_TPZMatrix<long_double>.super_TPZBaseMatrix.fCol)) {
        return (this->fK01).fElem + lVar3 * lVar8 + r;
      }
      TPZFMatrix<long_double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
  }
  else if (iVar7 < lVar3) {
    lVar3 = (this->fK10).super_TPZMatrix<long_double>.super_TPZBaseMatrix.fRow;
    if (((lVar5 < 0 || lVar3 <= lVar5) || (iVar7 < 0)) ||
       ((this->fK10).super_TPZMatrix<long_double>.super_TPZBaseMatrix.fCol <= iVar7)) {
      TPZFMatrix<long_double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    plVar4 = (this->fK10).fElem + lVar3 * iVar7;
    goto LAB_00d402e1;
  }
  lVar3 = (this->fK11).super_TPZMatrix<long_double>.super_TPZBaseMatrix.fRow;
  if (((lVar5 < 0 || lVar3 <= lVar5) || (lVar6 < 0)) ||
     ((this->fK11).super_TPZMatrix<long_double>.super_TPZBaseMatrix.fCol <= lVar6)) {
    TPZFMatrix<long_double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  plVar4 = (this->fK11).fElem + lVar3 * lVar6;
LAB_00d402e1:
  return plVar4 + lVar5;
}

Assistant:

TVar& TPZMatRed<TVar,TSideMatrix>::s(const int64_t r,const int64_t c ) {
	int64_t row(r),col(c);
	
	if (r < fDim0 && IsSymmetric() && row > col ) Swap( &row, &col );
	if (row<fDim0 &&  col<fDim0)  return ( fK00->s(row,col) );
	if (row<fDim0 &&  col>=fDim0)  return ( (TVar &)fK01.s(row,col-fDim0) );
	if (row>=fDim0 &&  col<fDim0)  return ( (TVar &)(fK10.s(row-fDim0,col)) );
	return ((TVar &)(fK11.s(row-fDim0,col-fDim0)) );
	
}